

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void slang::ast::SFormat::formatPattern
               (string *result,ConstantValue *arg,Type *type,FormatOptions *options,
               bool isStringLiteral)

{
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *buf;
  TypeVisitor visitor;
  string sStack_258;
  TypeVisitor local_238;
  
  local_238.abbreviated = options->zeroPad;
  local_238.buffer.buf.super_buffer<char>.size_ = 0;
  local_238.buffer.buf.super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_238.buffer.buf.super_buffer<char>.ptr_ = local_238.buffer.buf.store_;
  local_238.buffer.buf.super_buffer<char>.capacity_ = 500;
  local_238.buffer.showColors = false;
  local_238.isStringLiteral = isStringLiteral;
  Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
            (&type->super_Symbol,&local_238,arg);
  ::fmt::v11::to_string<500ul>(&sStack_258,(v11 *)&local_238.buffer,buf);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (result,&sStack_258);
  std::__cxx11::string::~string((string *)&sStack_258);
  ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate
            (&local_238.buffer.buf);
  return;
}

Assistant:

void formatPattern(std::string& result, const ConstantValue& arg, const Type& type,
                   const FormatOptions& options, bool isStringLiteral) {
    TypeVisitor visitor(options.zeroPad, isStringLiteral);
    type.visit(visitor, arg);
    result += visitor.buffer.str();
}